

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_backward_Test::TestBody
          (IntrusiveListIteratorTest_rbegin_rend_backward_Test *this)

{
  IntrusiveListIteratorTest *pIVar1;
  unsigned_long uVar2;
  bool bVar3;
  int *lhs;
  TestObject *pTVar4;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar5;
  TestObject *pTVar6;
  unsigned_long uVar7;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  int *local_88;
  IntrusiveListIteratorTest_rbegin_rend_backward_Test *local_80;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_78
  ;
  TestObject *local_68;
  unsigned_long local_60;
  AssertHelper local_58;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_50
  ;
  TestObjectList *local_40;
  undefined8 local_38;
  
  pTVar6 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_80 = this;
  lhs = (int *)operator_new(0xc);
  lhs[0] = 1;
  lhs[1] = 2;
  lhs[2] = 3;
  local_60 = 0;
  local_88 = lhs;
  if (pTVar6 != (TestObject *)0x0) {
    pIVar1 = &local_80->super_IntrusiveListIteratorTest;
    uVar2 = 1;
    do {
      uVar7 = uVar2;
      pTVar6 = (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      pTVar4 = pTVar6;
      if (pTVar6 == (TestObject *)0x0) {
        pTVar4 = (TestObject *)&pIVar1->list_;
      }
      if (((TestObjectList *)pTVar4)->last_ == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                      ,0xa0,
                      "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_78,"expected[count]","last->data",lhs,
                 &((TestObjectList *)pTVar4)->last_->data);
      if (local_78.current.list_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        if (local_78.current.node_ == (TestObject *)0x0) {
          pTVar6 = (TestObject *)0x274251;
        }
        else {
          pTVar6 = ((local_78.current.node_)->
                   super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,0xae,(char *)pTVar6);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_90.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_001df5f4;
        goto LAB_001df5d6;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_78.current.node_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lhs = lhs + 1;
      uVar2 = uVar7 + 1;
      local_60 = uVar7;
    } while (pTVar6 != (TestObject *)0x0);
  }
  local_90.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_78,"count","expected.size()",&local_60,(unsigned_long *)&local_90);
  if (local_78.current.list_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.current.node_ == (TestObject *)0x0) {
      pTVar6 = (TestObject *)0x274251;
    }
    else {
      pTVar6 = ((local_78.current.node_)->
               super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
               ,0xb1,(char *)pTVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_001df5d6:
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90.ptr_ + 8))();
      }
    }
  }
LAB_001df5f4:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.current.node_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete(local_88);
  local_50.current.list_ = (local_80->super_IntrusiveListIteratorTest).clist_;
  local_38 = 0;
  pTVar6 = (local_50.current.list_)->first_;
  local_50.current.node_ = pTVar6;
  local_40 = local_50.current.list_;
  piVar5 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  local_78.current.node_ = (TestObject *)((long)&piVar5->last_ + 4);
  piVar5->first_ = (TestObject *)0x200000001;
  *(undefined4 *)&piVar5->last_ = 3;
  local_78.current.list_ = piVar5;
  local_68 = local_78.current.node_;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_40,&local_50,&local_78,
             (vector<int,_std::allocator<int>_> *)pTVar6);
  operator_delete(piVar5);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_backward) {
  TestBackward(list_.rbegin(), list_.rend(), {1, 2, 3});
  TestBackward(clist_.rbegin(), clist_.rend(), {1, 2, 3});
}